

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenType TVar2;
  size_t __n;
  char *pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  Nonnull<char_*> pcVar7;
  char *__end;
  AlphaNum *in_R8;
  bool bVar8;
  string_view message;
  string_view message_00;
  string_view message_01;
  string text;
  string local_e0;
  string local_b0;
  undefined1 local_90 [48];
  AlphaNum local_60;
  
  iVar6 = this->recursion_limit_;
  this->recursion_limit_ = iVar6 + -1;
  if (iVar6 < 1) {
    local_e0._M_dataplus._M_p = (pointer)0x4b;
    local_e0._M_string_length = 0x14420a0;
    pcVar3 = local_60.digits_;
    pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (this->initial_recursion_limit_,pcVar3);
    local_60.piece_._M_len = (size_t)(pcVar7 + -(long)pcVar3);
    local_90._0_8_ = (char *)0x1;
    local_90._8_8_ = ".";
    local_60.piece_._M_str = pcVar3;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b0,(lts_20250127 *)&local_e0,&local_60,(AlphaNum *)local_90,in_R8);
    message._M_str = local_b0._M_dataplus._M_p;
    message._M_len = local_b0._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return false;
    }
    goto LAB_00ffaae4;
  }
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_STRING) {
    while ((this_00->current_).type == TYPE_STRING) {
      io::Tokenizer::Next(this_00);
    }
  }
  else {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"[","");
    bVar5 = TryConsume(this,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
      bVar5 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        do {
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"{","");
          __n = (this->tokenizer_).current_.text._M_string_length;
          if (__n == local_e0._M_string_length) {
            if (__n == 0) {
              bVar5 = true;
            }
            else {
              iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           local_e0._M_dataplus._M_p,__n);
              bVar5 = iVar6 == 0;
            }
          }
          else {
            bVar5 = false;
          }
          if (bVar5) {
LAB_00ffa8eb:
            bVar8 = false;
          }
          else {
            local_60.piece_._M_len = (size_t)local_60.digits_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"<","");
            pcVar3 = (char *)(this->tokenizer_).current_.text._M_string_length;
            bVar8 = true;
            if (pcVar3 == local_60.piece_._M_str) {
              if (pcVar3 == (char *)0x0) goto LAB_00ffa8eb;
              iVar6 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           (void *)local_60.piece_._M_len,(size_t)pcVar3);
              bVar8 = iVar6 != 0;
            }
          }
          if ((!bVar5) && ((char *)local_60.piece_._M_len != local_60.digits_)) {
            operator_delete((void *)local_60.piece_._M_len,local_60.digits_._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (bVar8) {
            bVar5 = SkipFieldValue(this);
          }
          else {
            bVar5 = SkipFieldMessage(this);
          }
          if (bVar5 == false) {
            return false;
          }
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"]","");
          bVar5 = TryConsume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (bVar5) break;
          local_e0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,",","");
          bVar5 = Consume(this,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != paVar1) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (!bVar5) {
            return false;
          }
        } while( true );
      }
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"-","");
      bVar5 = TryConsume(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      TVar2 = (this_00->current_).type;
      if (2 < TVar2 - TYPE_IDENTIFIER) {
        pcVar4 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_90._0_8_ = local_90 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar4,
                   pcVar4 + (this->tokenizer_).current_.text._M_string_length);
        local_e0._M_dataplus._M_p = &DAT_0000002b;
        local_e0._M_string_length = 0x14420ec;
        local_60.piece_._M_len = local_90._8_8_;
        local_60.piece_._M_str = (char *)local_90._0_8_;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_b0,(lts_20250127 *)&local_e0,&local_60,(AlphaNum *)local_90._8_8_);
        message_01._M_str = local_b0._M_dataplus._M_p;
        message_01._M_len = local_b0._M_string_length;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        this->recursion_limit_ = this->recursion_limit_ + 1;
        local_b0.field_2._M_allocated_capacity = local_90._16_8_;
        local_b0._M_dataplus._M_p = (pointer)local_90._0_8_;
        if ((undefined1 *)local_90._0_8_ == local_90 + 0x10) {
          return false;
        }
LAB_00ffaae4:
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        return false;
      }
      if (bVar5 && TVar2 == TYPE_IDENTIFIER) {
        pcVar3 = local_90 + 0x10;
        pcVar4 = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_90._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar4,
                   pcVar4 + (this->tokenizer_).current_.text._M_string_length);
        absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)local_90);
        iVar6 = std::__cxx11::string::compare(local_90);
        if (((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare(local_90), iVar6 != 0)) &&
           (iVar6 = std::__cxx11::string::compare(local_90), iVar6 != 0)) {
          local_e0._M_dataplus._M_p = &DAT_00000016;
          local_e0._M_string_length = 0x1442121;
          local_60.piece_._M_len = local_90._8_8_;
          local_60.piece_._M_str = (char *)local_90._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_b0,(lts_20250127 *)&local_e0,&local_60,(AlphaNum *)local_90._8_8_);
          message_00._M_str = local_b0._M_dataplus._M_p;
          message_00._M_len = local_b0._M_string_length;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          this->recursion_limit_ = this->recursion_limit_ + 1;
          local_b0.field_2._M_allocated_capacity = local_90._16_8_;
          local_b0._M_dataplus._M_p = (pointer)local_90._0_8_;
          if ((char *)local_90._0_8_ == pcVar3) {
            return false;
          }
          goto LAB_00ffaae4;
        }
        if ((char *)local_90._0_8_ != pcVar3) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
      }
      io::Tokenizer::Next(this_00);
    }
  }
  this->recursion_limit_ = this->recursion_limit_ + 1;
  return true;
}

Assistant:

bool SkipFieldValue() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
        tokenizer_.Next();
      }
      ++recursion_limit_;
      return true;
    }
    if (TryConsume("[")) {
      if (!TryConsume("]")) {
        while (true) {
          if (!LookingAt("{") && !LookingAt("<")) {
            DO(SkipFieldValue());
          } else {
            DO(SkipFieldMessage());
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
      ++recursion_limit_;
      return true;
    }
    // Possible field values other than string:
    //   12345        => TYPE_INTEGER
    //   -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //   1.2345       => TYPE_FLOAT
    //   -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //   inf          => TYPE_IDENTIFIER
    //   -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    //   TYPE_INTEGER => TYPE_IDENTIFIER
    // Divides them into two group, one with TYPE_SYMBOL
    // and the other without:
    //   Group one:
    //     12345        => TYPE_INTEGER
    //     1.2345       => TYPE_FLOAT
    //     inf          => TYPE_IDENTIFIER
    //     TYPE_INTEGER => TYPE_IDENTIFIER
    //   Group two:
    //     -12345       => TYPE_SYMBOL + TYPE_INTEGER
    //     -1.2345      => TYPE_SYMBOL + TYPE_FLOAT
    //     -inf         => TYPE_SYMBOL + TYPE_IDENTIFIER
    // As we can see, the field value consists of an optional '-' and one of
    // TYPE_INTEGER, TYPE_FLOAT and TYPE_IDENTIFIER.
    bool has_minus = TryConsume("-");
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER) &&
        !LookingAtType(io::Tokenizer::TYPE_FLOAT) &&
        !LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      ReportError(
          absl::StrCat("Cannot skip field value, unexpected token: ", text));
      ++recursion_limit_;
      return false;
    }
    // Combination of '-' and TYPE_IDENTIFIER may result in an invalid field
    // value while other combinations all generate valid values.
    // We check if the value of this combination is valid here.
    // TYPE_IDENTIFIER after a '-' should be one of the float values listed
    // below:
    //   inf, inff, infinity, nan
    if (has_minus && LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      std::string text = tokenizer_.current().text;
      absl::AsciiStrToLower(&text);
      if (text != "inf" &&
          text != "infinity" && text != "nan") {
        ReportError(absl::StrCat("Invalid float number: ", text));
        ++recursion_limit_;
        return false;
      }
    }
    tokenizer_.Next();
    ++recursion_limit_;
    return true;
  }